

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall duckdb::Serializer::WriteValue<double>(Serializer *this,vector<double,_true> *vec)

{
  pointer pdVar1;
  double *item;
  pointer pdVar2;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->super_vector<double,_std::allocator<double>_>).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(vec->super_vector<double,_std::allocator<double>_>).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3);
  pdVar1 = (vec->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar2 = (vec->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    (*this->_vptr_Serializer[0x1a])(*pdVar2,this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}